

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O0

int KVStore::getLevel(string *path)

{
  int iVar1;
  string local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string *path_local;
  
  std::__cxx11::string::find((char *)path,0x11c00e);
  std::__cxx11::string::substr((ulong)local_30,(ulong)path);
  iVar1 = std::__cxx11::stoi(local_30,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

int KVStore::getLevel(const string &path) {
  auto s = path.substr(path.find("level-") + 6);
  return stoi(s);
}